

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint uVar1;
  char c;
  int n;
  priority_queue<int,_std::less<int>_> pq;
  
  pq.mData = (int *)operator_new__(4);
  *pq.mData = 0;
  pq.mCap = 1;
  pq.mSize = 0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          __isoc99_scanf("%c",&c);
          if (c != 'a') break;
          __isoc99_scanf("%d",&n);
          CP::priority_queue<int,_std::less<int>_>::push(&pq,&n);
        }
        if (c != 'd') break;
        CP::priority_queue<int,_std::less<int>_>::pop(&pq);
      }
      if (c != 'h') break;
      uVar1 = CP::priority_queue<int,_std::less<int>_>::height(&pq);
      printf("Binary Heap with %d nodes has height %d\n",pq.mSize & 0xffffffff,(ulong)uVar1);
    }
  } while (c != 'q');
  CP::priority_queue<int,_std::less<int>_>::~priority_queue(&pq);
  return 0;
}

Assistant:

int main() {
  CP::priority_queue<int> pq;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a') {
      // add data
      int n;
      scanf("%d", &n);
      pq.push(n);
    } else if (c == 'h') {
      int r = pq.height();
      int n = pq.size();
      printf("Binary Heap with %d nodes has height %d\n",n,r);
    } else if (c == 'd') {
       pq.pop();
    }
    scanf("%c", &c);
  }
  return 0;
}